

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Track * __thiscall mkvparser::Tracks::GetTrackByNumber(Tracks *this,long tn)

{
  Track **ppTVar1;
  long lVar2;
  Track **ppTVar3;
  Track *pTrack;
  Track **j;
  Track **i;
  long tn_local;
  Tracks *this_local;
  
  if (tn < 0) {
    this_local = (Tracks *)0x0;
  }
  else {
    ppTVar1 = this->m_trackEntriesEnd;
    j = this->m_trackEntries;
    do {
      if (j == ppTVar1) {
        return (Track *)0x0;
      }
      ppTVar3 = j + 1;
      this_local = (Tracks *)*j;
      j = ppTVar3;
    } while (((Track *)this_local == (Track *)0x0) ||
            (lVar2 = Track::GetNumber((Track *)this_local), tn != lVar2));
  }
  return (Track *)this_local;
}

Assistant:

const Track* Tracks::GetTrackByNumber(long tn) const {
  if (tn < 0)
    return NULL;

  Track** i = m_trackEntries;
  Track** const j = m_trackEntriesEnd;

  while (i != j) {
    Track* const pTrack = *i++;

    if (pTrack == NULL)
      continue;

    if (tn == pTrack->GetNumber())
      return pTrack;
  }

  return NULL;  // not found
}